

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# molecule.cpp
# Opt level: O0

void __thiscall indigox::Molecule::RemoveBond(Molecule *this,Bond_p *b)

{
  byte bVar1;
  bool bVar2;
  const_iterator __position;
  iterator this_00;
  Bond_p *in_RDI;
  Bond_p hit;
  __normal_iterator<std::shared_ptr<indigox::Bond>_*,_std::vector<std::shared_ptr<indigox::Bond>,_std::allocator<std::shared_ptr<indigox::Bond>_>_>_>
  it;
  vector<std::shared_ptr<indigox::Bond>,_std::allocator<std::shared_ptr<indigox::Bond>_>_>
  *in_stack_fffffffffffffee8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *__x;
  shared_ptr<indigox::Bond> *in_stack_fffffffffffffef0;
  Bond *in_stack_fffffffffffffef8;
  __normal_iterator<std::shared_ptr<indigox::Bond>_*,_std::vector<std::shared_ptr<indigox::Bond>,_std::allocator<std::shared_ptr<indigox::Bond>_>_>_>
  in_stack_ffffffffffffff00;
  vector<std::shared_ptr<indigox::Bond>,_std::allocator<std::shared_ptr<indigox::Bond>_>_> *this_01;
  __normal_iterator<std::shared_ptr<indigox::Bond>_*,_std::vector<std::shared_ptr<indigox::Bond>,_std::allocator<std::shared_ptr<indigox::Bond>_>_>_>
  in_stack_ffffffffffffff08;
  undefined7 in_stack_ffffffffffffff20;
  Atom *in_stack_ffffffffffffff40;
  vector<std::shared_ptr<indigox::Bond>,_std::allocator<std::shared_ptr<indigox::Bond>_>_>
  local_b0 [3];
  shared_ptr<indigox::Bond> *local_60;
  shared_ptr<indigox::Bond> *local_58;
  shared_ptr<indigox::Bond> *local_50;
  __normal_iterator<std::shared_ptr<indigox::Bond>_*,_std::vector<std::shared_ptr<indigox::Bond>,_std::allocator<std::shared_ptr<indigox::Bond>_>_>_>
  local_48 [9];
  
  std::__shared_ptr_access<indigox::Bond,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<indigox::Bond,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x11207b);
  Bond::GetMolecule(in_stack_fffffffffffffef8);
  std::enable_shared_from_this<indigox::Molecule>::shared_from_this
            ((enable_shared_from_this<indigox::Molecule> *)in_stack_fffffffffffffee8);
  bVar1 = std::operator!=((shared_ptr<indigox::Molecule> *)in_stack_fffffffffffffef0,
                          (shared_ptr<indigox::Molecule> *)in_stack_fffffffffffffee8);
  std::shared_ptr<indigox::Molecule>::~shared_ptr((shared_ptr<indigox::Molecule> *)0x1120c9);
  std::shared_ptr<indigox::Molecule>::~shared_ptr((shared_ptr<indigox::Molecule> *)0x1120d6);
  if ((bVar1 & 1) == 0) {
    local_50 = (shared_ptr<indigox::Bond> *)
               std::
               vector<std::shared_ptr<indigox::Bond>,_std::allocator<std::shared_ptr<indigox::Bond>_>_>
               ::begin(in_stack_fffffffffffffee8);
    local_58 = (shared_ptr<indigox::Bond> *)
               std::
               vector<std::shared_ptr<indigox::Bond>,_std::allocator<std::shared_ptr<indigox::Bond>_>_>
               ::end(in_stack_fffffffffffffee8);
    local_48[0] = std::
                  find<__gnu_cxx::__normal_iterator<std::shared_ptr<indigox::Bond>*,std::vector<std::shared_ptr<indigox::Bond>,std::allocator<std::shared_ptr<indigox::Bond>>>>,std::shared_ptr<indigox::Bond>>
                            (in_stack_ffffffffffffff08,in_stack_ffffffffffffff00,
                             (shared_ptr<indigox::Bond> *)in_stack_fffffffffffffef8);
    local_60 = (shared_ptr<indigox::Bond> *)
               std::
               vector<std::shared_ptr<indigox::Bond>,_std::allocator<std::shared_ptr<indigox::Bond>_>_>
               ::end(in_stack_fffffffffffffee8);
    bVar2 = __gnu_cxx::operator!=
                      ((__normal_iterator<std::shared_ptr<indigox::Bond>_*,_std::vector<std::shared_ptr<indigox::Bond>,_std::allocator<std::shared_ptr<indigox::Bond>_>_>_>
                        *)in_stack_fffffffffffffef0,
                       (__normal_iterator<std::shared_ptr<indigox::Bond>_*,_std::vector<std::shared_ptr<indigox::Bond>,_std::allocator<std::shared_ptr<indigox::Bond>_>_>_>
                        *)in_stack_fffffffffffffee8);
    if (bVar2) {
      __gnu_cxx::
      __normal_iterator<std::shared_ptr<indigox::Bond>_*,_std::vector<std::shared_ptr<indigox::Bond>,_std::allocator<std::shared_ptr<indigox::Bond>_>_>_>
      ::operator*(local_48);
      std::shared_ptr<indigox::Bond>::shared_ptr
                (in_stack_fffffffffffffef0,(shared_ptr<indigox::Bond> *)in_stack_fffffffffffffee8);
      std::__shared_ptr_access<indigox::Bond,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                ((__shared_ptr_access<indigox::Bond,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                 0x1121b9);
      Bond::GetSourceAtom(in_stack_fffffffffffffef8);
      __position._M_current =
           (shared_ptr<indigox::Bond> *)
           std::__shared_ptr_access<indigox::Atom,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<indigox::Atom,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x1121d8);
      std::shared_ptr<indigox::Bond>::shared_ptr
                (in_stack_fffffffffffffef0,(shared_ptr<indigox::Bond> *)in_stack_fffffffffffffee8);
      Atom::RemoveBond(in_stack_ffffffffffffff40,in_RDI);
      std::shared_ptr<indigox::Bond>::~shared_ptr((shared_ptr<indigox::Bond> *)0x112215);
      std::shared_ptr<indigox::Atom>::~shared_ptr((shared_ptr<indigox::Atom> *)0x112222);
      std::__shared_ptr_access<indigox::Bond,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                ((__shared_ptr_access<indigox::Bond,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                 0x11222f);
      Bond::GetTargetAtom(in_stack_fffffffffffffef8);
      std::__shared_ptr_access<indigox::Atom,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                ((__shared_ptr_access<indigox::Atom,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                 0x112248);
      this_01 = local_b0;
      std::shared_ptr<indigox::Bond>::shared_ptr
                (in_stack_fffffffffffffef0,(shared_ptr<indigox::Bond> *)in_stack_fffffffffffffee8);
      Atom::RemoveBond(in_stack_ffffffffffffff40,in_RDI);
      std::shared_ptr<indigox::Bond>::~shared_ptr((shared_ptr<indigox::Bond> *)0x11227f);
      std::shared_ptr<indigox::Atom>::~shared_ptr((shared_ptr<indigox::Atom> *)0x112289);
      __x = &in_RDI[5].super___shared_ptr<indigox::Bond,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
      __gnu_cxx::
      __normal_iterator<std::shared_ptr<indigox::Bond>const*,std::vector<std::shared_ptr<indigox::Bond>,std::allocator<std::shared_ptr<indigox::Bond>>>>
      ::__normal_iterator<std::shared_ptr<indigox::Bond>*>
                ((__normal_iterator<const_std::shared_ptr<indigox::Bond>_*,_std::vector<std::shared_ptr<indigox::Bond>,_std::allocator<std::shared_ptr<indigox::Bond>_>_>_>
                  *)in_stack_fffffffffffffef0,
                 (__normal_iterator<std::shared_ptr<indigox::Bond>_*,_std::vector<std::shared_ptr<indigox::Bond>,_std::allocator<std::shared_ptr<indigox::Bond>_>_>_>
                  *)__x);
      this_00 = std::
                vector<std::shared_ptr<indigox::Bond>,_std::allocator<std::shared_ptr<indigox::Bond>_>_>
                ::erase(this_01,__position);
      std::
      map<std::shared_ptr<indigox::Bond>,_boost::detail::edge_desc_impl<boost::undirected_tag,_void_*>,_std::less<std::shared_ptr<indigox::Bond>_>,_std::allocator<std::pair<const_std::shared_ptr<indigox::Bond>,_boost::detail::edge_desc_impl<boost::undirected_tag,_void_*>_>_>_>
      ::erase((map<std::shared_ptr<indigox::Bond>,_boost::detail::edge_desc_impl<boost::undirected_tag,_void_*>,_std::less<std::shared_ptr<indigox::Bond>_>,_std::allocator<std::pair<const_std::shared_ptr<indigox::Bond>,_boost::detail::edge_desc_impl<boost::undirected_tag,_void_*>_>_>_>
               *)this_00._M_current,(key_type *)__x);
      std::__shared_ptr_access<indigox::Bond,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                ((__shared_ptr_access<indigox::Bond,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                 0x1122ef);
      Bond::Clear((Bond *)CONCAT17(bVar1,in_stack_ffffffffffffff20));
      *(undefined1 *)
       &in_RDI[0x15].super___shared_ptr<indigox::Bond,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
           = 1;
      std::shared_ptr<indigox::Bond>::~shared_ptr((shared_ptr<indigox::Bond> *)0x112312);
    }
  }
  return;
}

Assistant:

void Molecule::RemoveBond(Bond_p b) {
  if (b->GetMolecule() != shared_from_this()) return;
  auto it = std::find(bonds_.begin(), bonds_.end(), b);
  if (it != bonds_.end()) {
    Bond_p hit = *it;
    hit->GetSourceAtom()->RemoveBond(hit);
    hit->GetTargetAtom()->RemoveBond(hit);
    bonds_.erase(it);
    bond_to_edge_.erase(hit);
    hit->Clear();
    modified_ = true;
  }
}